

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

void cmSystemTools::MoveFileIfDifferent(string *source,string *destination)

{
  bool bVar1;
  int iVar2;
  
  bVar1 = cmsys::SystemTools::FilesDiffer(source,destination);
  if (bVar1) {
    iVar2 = rename((source->_M_dataplus)._M_p,(destination->_M_dataplus)._M_p);
    if (iVar2 == 0) {
      return;
    }
    cmsys::SystemTools::CopyFileAlways(source,destination);
  }
  cmsys::SystemTools::RemoveFile(source);
  return;
}

Assistant:

void cmSystemTools::MoveFileIfDifferent(const std::string& source,
                                        const std::string& destination)
{
  if (FilesDiffer(source, destination)) {
    if (RenameFile(source, destination)) {
      return;
    }
    CopyFileAlways(source, destination);
  }
  RemoveFile(source);
}